

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O0

void Acb_NtkPushLogic2(Acb_Ntk_t *p,int nLutSize,int fVerbose)

{
  int iVar1;
  Acb_ObjType_t AVar2;
  int iFanout;
  int local_1c;
  int iObj;
  int fVerbose_local;
  int nLutSize_local;
  Acb_Ntk_t *p_local;
  
  Acb_NtkCreateFanout(p);
  local_1c = 1;
  while ((iVar1 = Vec_StrSize(&p->vObjType), local_1c < iVar1 &&
         ((AVar2 = Acb_ObjType(p,local_1c), AVar2 == ABC_OPER_NONE ||
          (iVar1 = Acb_ObjIsCio(p,local_1c), iVar1 != 0))))) {
    local_1c = local_1c + 1;
  }
  iVar1 = Acb_ObjFaninNum(p,local_1c);
  iFanout = Acb_ObjFanout(p,local_1c,0);
  Acb_ObjPushToFanout(p,local_1c,iVar1 + -1,iFanout);
  return;
}

Assistant:

void Acb_NtkPushLogic2( Acb_Ntk_t * p, int nLutSize, int fVerbose )
{
    int iObj;
    Acb_NtkCreateFanout( p );  // fanout data structure
    Acb_NtkForEachObj( p, iObj )
        if ( !Acb_ObjIsCio(p, iObj) )
            break;
    Acb_ObjPushToFanout( p, iObj, Acb_ObjFaninNum(p, iObj)-1, Acb_ObjFanout(p, iObj, 0) );
//    Acb_ObjPushToFanin( p, Acb_ObjFanout(p, iObj, 0), Acb_ObjFaninNum(p, iObj)-1, iObj );
}